

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  ImVec2 *pIVar1;
  long lVar2;
  ImDrawList *pIVar3;
  ImDrawIdx IVar4;
  float fVar5;
  float fVar6;
  ImVec2 IVar7;
  ImVec2 aIStack_280 [2];
  int local_26c;
  float local_268;
  float local_264;
  ImVec2 *local_260;
  ImVec2 *local_258;
  ImVec2 *local_250;
  ImVec2 *local_248;
  ImVec2 *local_240;
  ImVec2 *local_238;
  ImVec2 *local_230;
  float local_224;
  ImVec2 *local_220;
  float local_218;
  float local_214;
  ImVec2 *local_210;
  ImVec2 *local_208;
  ImVec2 *local_200;
  float local_1f4;
  ImVec2 *local_1f0;
  float local_1e4;
  uint local_1e0;
  int local_1dc;
  ImDrawList *local_1d8;
  float local_1d0;
  float local_1cc;
  float inv_len_1;
  float d2_3;
  float dy_1;
  float dx_1;
  ImVec2 *p2;
  ImVec2 *p1;
  int local_1a8;
  int i2_3;
  int i1_3;
  int vtx_count_1;
  int idx_count_1;
  int i_1;
  ImVec2 *out_vtx_1;
  float dm_in_y;
  float dm_in_x;
  float dm_out_y;
  float dm_out_x;
  float inv_lensq_1;
  float d2_2;
  float dm_y_1;
  float dm_x_1;
  uint idx2_1;
  int i2_2;
  int i1_2;
  uint idx1_1;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  float local_e0;
  int local_dc;
  float half_inner_thickness;
  int i;
  ImVec2 *out_vtx;
  float inv_lensq;
  float d2_1;
  float dm_y;
  float dm_x;
  uint idx2;
  int i2_1;
  int i1_1;
  uint idx1;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  float local_70;
  float local_6c;
  float inv_len;
  float d2;
  float dy;
  float dx;
  int i2;
  int i1;
  ImVec2 *temp_points;
  ImVec2 *temp_normals;
  int vtx_count;
  int idx_count;
  ImU32 col_trans;
  float AA_SIZE;
  bool thick_line;
  ImVec2 IStack_30;
  int count;
  ImVec2 uv;
  float thickness_local;
  bool closed_local;
  ImU32 col_local;
  int points_count_local;
  ImVec2 *points_local;
  ImDrawList *this_local;
  
  if (1 < points_count) {
    IStack_30 = this->_Data->TexUvWhitePixel;
    AA_SIZE = (float)points_count;
    if (!closed) {
      AA_SIZE = (float)(points_count + -1);
    }
    col_trans._3_1_ = 1.0 < thickness;
    local_1d8 = this;
    uv.x = thickness;
    uv.y._3_1_ = closed;
    if ((this->Flags & 1U) == 0) {
      i1_3 = (int)AA_SIZE * 6;
      i2_3 = (int)AA_SIZE << 2;
      aIStack_280[0].x = 4.792097e-39;
      aIStack_280[0].y = 0.0;
      PrimReserve(this,i1_3,i2_3);
      for (local_1a8 = 0; local_1a8 < (int)AA_SIZE; local_1a8 = local_1a8 + 1) {
        if (local_1a8 + 1 == points_count) {
          local_26c = 0;
        }
        else {
          local_26c = local_1a8 + 1;
        }
        p1._4_4_ = local_26c;
        p2 = points + local_1a8;
        _dy_1 = points + local_26c;
        d2_3 = _dy_1->x - p2->x;
        inv_len_1 = _dy_1->y - p2->y;
        local_1cc = d2_3 * d2_3 + inv_len_1 * inv_len_1;
        if (0.0 < local_1cc) {
          aIStack_280[0].x = 4.792469e-39;
          aIStack_280[0].y = 0.0;
          local_1d0 = ImSqrt(local_1cc);
          local_1d0 = 1.0 / local_1d0;
          d2_3 = local_1d0 * d2_3;
          inv_len_1 = local_1d0 * inv_len_1;
        }
        fVar5 = uv.x * 0.5 * d2_3;
        fVar6 = uv.x * 0.5 * inv_len_1;
        (local_1d8->_VtxWritePtr->pos).x = p2->x + fVar6;
        (local_1d8->_VtxWritePtr->pos).y = p2->y - fVar5;
        local_1d8->_VtxWritePtr->uv = IStack_30;
        local_1d8->_VtxWritePtr->col = col;
        local_1d8->_VtxWritePtr[1].pos.x = _dy_1->x + fVar6;
        local_1d8->_VtxWritePtr[1].pos.y = _dy_1->y - fVar5;
        local_1d8->_VtxWritePtr[1].uv = IStack_30;
        local_1d8->_VtxWritePtr[1].col = col;
        local_1d8->_VtxWritePtr[2].pos.x = _dy_1->x - fVar6;
        local_1d8->_VtxWritePtr[2].pos.y = _dy_1->y + fVar5;
        local_1d8->_VtxWritePtr[2].uv = IStack_30;
        local_1d8->_VtxWritePtr[2].col = col;
        local_1d8->_VtxWritePtr[3].pos.x = p2->x - fVar6;
        local_1d8->_VtxWritePtr[3].pos.y = p2->y + fVar5;
        local_1d8->_VtxWritePtr[3].uv = IStack_30;
        local_1d8->_VtxWritePtr[3].col = col;
        local_1d8->_VtxWritePtr = local_1d8->_VtxWritePtr + 4;
        *local_1d8->_IdxWritePtr = (ImDrawIdx)local_1d8->_VtxCurrentIdx;
        local_1d8->_IdxWritePtr[1] = (short)local_1d8->_VtxCurrentIdx + 1;
        local_1d8->_IdxWritePtr[2] = (short)local_1d8->_VtxCurrentIdx + 2;
        local_1d8->_IdxWritePtr[3] = (ImDrawIdx)local_1d8->_VtxCurrentIdx;
        local_1d8->_IdxWritePtr[4] = (short)local_1d8->_VtxCurrentIdx + 2;
        local_1d8->_IdxWritePtr[5] = (short)local_1d8->_VtxCurrentIdx + 3;
        local_1d8->_IdxWritePtr = local_1d8->_IdxWritePtr + 6;
        local_1d8->_VtxCurrentIdx = local_1d8->_VtxCurrentIdx + 4;
      }
    }
    else {
      idx_count = 0x3f800000;
      vtx_count = col & 0xffffff;
      if ((bool)col_trans._3_1_) {
        local_1dc = (int)AA_SIZE * 0x12;
      }
      else {
        local_1dc = (int)AA_SIZE * 0xc;
      }
      temp_normals._4_4_ = local_1dc;
      if ((bool)col_trans._3_1_) {
        local_1e0 = points_count << 2;
      }
      else {
        local_1e0 = points_count * 3;
      }
      temp_normals._0_4_ = local_1e0;
      aIStack_280[0].x = 4.78595e-39;
      aIStack_280[0].y = 0.0;
      PrimReserve(this,local_1dc,local_1e0);
      lVar2 = -((long)(int)(points_count * ((col_trans._3_1_ & 1) * 2 + 3)) * 8 + 0xfU &
               0xfffffffffffffff0);
      temp_points = (ImVec2 *)((long)aIStack_280 + lVar2 + 8);
      _i2 = temp_points + points_count;
      for (dx = 0.0; pIVar1 = temp_points, (int)dx < (int)AA_SIZE; dx = (float)((int)dx + 1)) {
        if ((int)dx + 1 == points_count) {
          local_1e4 = 0.0;
        }
        else {
          local_1e4 = (float)((int)dx + 1);
        }
        dy = local_1e4;
        d2 = points[(int)local_1e4].x - points[(int)dx].x;
        inv_len = points[(int)local_1e4].y - points[(int)dx].y;
        fVar5 = d2 * d2 + inv_len * inv_len;
        local_6c = fVar5;
        if (0.0 < fVar5) {
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x341e3e;
          local_70 = ImSqrt(fVar5);
          local_70 = 1.0 / local_70;
          d2 = local_70 * d2;
          inv_len = local_70 * inv_len;
        }
        temp_points[(int)dx].x = inv_len;
        temp_points[(int)dx].y = -d2;
      }
      if ((uv.y._3_1_ & 1) == 0) {
        temp_points[points_count + -1] = temp_points[points_count + -2];
      }
      if ((col_trans._3_1_ & 1) == 0) {
        if ((uv.y._3_1_ & 1) == 0) {
          local_1f4 = 1.0;
          local_210 = points;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x341f10;
          local_80 = ::operator*(pIVar1,1.0);
          pIVar1 = local_210;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x341f25;
          local_78 = ::operator+(pIVar1,&local_80);
          fVar5 = local_1f4;
          *_i2 = local_78;
          pIVar1 = temp_points;
          local_208 = points;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x341f54;
          local_90 = ::operator*(pIVar1,fVar5);
          pIVar1 = local_208;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x341f6f;
          local_88 = ::operator-(pIVar1,&local_90);
          fVar5 = local_1f4;
          _i2[1] = local_88;
          local_200 = points + (points_count + -1);
          pIVar1 = temp_points + (points_count + -1);
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x341faf;
          local_a0 = ::operator*(pIVar1,fVar5);
          pIVar1 = local_200;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x341fca;
          IVar7 = ::operator+(pIVar1,&local_a0);
          fVar5 = local_1f4;
          _i2[points_count * 2 + -2] = IVar7;
          local_1f0 = points + (points_count + -1);
          pIVar1 = temp_points + (points_count + -1);
          local_98 = IVar7;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x34201c;
          _i1_1 = ::operator*(pIVar1,fVar5);
          pIVar1 = local_1f0;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x342037;
          IVar7 = ::operator-(pIVar1,(ImVec2 *)&i1_1);
          _i2[(points_count + -1) * 2 + 1] = IVar7;
        }
        i2_1 = local_1d8->_VtxCurrentIdx;
        for (idx2 = 0; pIVar3 = local_1d8, (int)idx2 < (int)AA_SIZE; idx2 = idx2 + 1) {
          if (idx2 + 1 == points_count) {
            local_214 = 0.0;
          }
          else {
            local_214 = (float)(idx2 + 1);
          }
          dm_x = local_214;
          if (idx2 + 1 == points_count) {
            local_218 = (float)local_1d8->_VtxCurrentIdx;
          }
          else {
            local_218 = (float)(i2_1 + 3);
          }
          dm_y = local_218;
          fVar5 = (temp_points[(int)idx2].x + temp_points[(int)local_214].x) * 0.5;
          fVar6 = (temp_points[(int)idx2].y + temp_points[(int)local_214].y) * 0.5;
          out_vtx._4_4_ = fVar5 * fVar5 + fVar6 * fVar6;
          if (out_vtx._4_4_ < 0.5) {
            out_vtx._4_4_ = 0.5;
          }
          d2_1 = (1.0 / out_vtx._4_4_) * fVar5 * 1.0;
          inv_lensq = (1.0 / out_vtx._4_4_) * fVar6 * 1.0;
          _half_inner_thickness = _i2 + ((int)local_214 << 1);
          _half_inner_thickness->x = points[(int)local_214].x + d2_1;
          _half_inner_thickness->y = points[(int)dm_x].y + inv_lensq;
          _half_inner_thickness[1].x = points[(int)dm_x].x - d2_1;
          _half_inner_thickness[1].y = points[(int)dm_x].y - inv_lensq;
          IVar4 = SUB42(dm_y,0);
          *pIVar3->_IdxWritePtr = IVar4;
          pIVar3->_IdxWritePtr[1] = (ImDrawIdx)i2_1;
          pIVar3->_IdxWritePtr[2] = (ImDrawIdx)i2_1 + 2;
          pIVar3->_IdxWritePtr[3] = (ImDrawIdx)i2_1 + 2;
          pIVar3->_IdxWritePtr[4] = IVar4 + 2;
          pIVar3->_IdxWritePtr[5] = IVar4;
          pIVar3->_IdxWritePtr[6] = IVar4 + 1;
          pIVar3->_IdxWritePtr[7] = (ImDrawIdx)i2_1 + 1;
          pIVar3->_IdxWritePtr[8] = (ImDrawIdx)i2_1;
          pIVar3->_IdxWritePtr[9] = (ImDrawIdx)i2_1;
          pIVar3->_IdxWritePtr[10] = IVar4;
          pIVar3->_IdxWritePtr[0xb] = IVar4 + 1;
          pIVar3->_IdxWritePtr = pIVar3->_IdxWritePtr + 0xc;
          i2_1 = (int)dm_y;
        }
        for (local_dc = 0; local_dc < points_count; local_dc = local_dc + 1) {
          local_1d8->_VtxWritePtr->pos = points[local_dc];
          local_1d8->_VtxWritePtr->uv = IStack_30;
          local_1d8->_VtxWritePtr->col = col;
          local_1d8->_VtxWritePtr[1].pos = _i2[local_dc << 1];
          local_1d8->_VtxWritePtr[1].uv = IStack_30;
          local_1d8->_VtxWritePtr[1].col = vtx_count;
          local_1d8->_VtxWritePtr[2].pos = _i2[local_dc * 2 + 1];
          local_1d8->_VtxWritePtr[2].uv = IStack_30;
          local_1d8->_VtxWritePtr[2].col = vtx_count;
          local_1d8->_VtxWritePtr = local_1d8->_VtxWritePtr + 3;
        }
      }
      else {
        local_e0 = (uv.x - 1.0) * 0.5;
        if ((uv.y._3_1_ & 1) == 0) {
          local_224 = 1.0;
          fVar5 = local_e0 + 1.0;
          local_260 = points;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x34252e;
          local_f0 = ::operator*(pIVar1,fVar5);
          pIVar1 = local_260;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x342549;
          local_e8 = ::operator+(pIVar1,&local_f0);
          *_i2 = local_e8;
          pIVar1 = temp_points;
          fVar5 = local_e0;
          local_258 = points;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x34257b;
          local_100 = ::operator*(pIVar1,fVar5);
          pIVar1 = local_258;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x342596;
          local_f8 = ::operator+(pIVar1,&local_100);
          _i2[1] = local_f8;
          pIVar1 = temp_points;
          fVar5 = local_e0;
          local_250 = points;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x3425c9;
          local_110 = ::operator*(pIVar1,fVar5);
          pIVar1 = local_250;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x3425e4;
          local_108 = ::operator-(pIVar1,&local_110);
          fVar5 = local_224;
          _i2[2] = local_108;
          pIVar1 = temp_points;
          fVar5 = local_e0 + fVar5;
          local_248 = points;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x342623;
          local_120 = ::operator*(pIVar1,fVar5);
          pIVar1 = local_248;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x34263e;
          local_118 = ::operator-(pIVar1,&local_120);
          fVar5 = local_224;
          _i2[3] = local_118;
          local_240 = points + (points_count + -1);
          pIVar1 = temp_points + (points_count + -1);
          fVar5 = local_e0 + fVar5;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x34268d;
          local_130 = ::operator*(pIVar1,fVar5);
          pIVar1 = local_240;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x3426a8;
          IVar7 = ::operator+(pIVar1,&local_130);
          fVar5 = local_e0;
          _i2[points_count * 4 + -4] = IVar7;
          local_238 = points + (points_count + -1);
          pIVar1 = temp_points + (points_count + -1);
          local_128 = IVar7;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x3426fa;
          local_140 = ::operator*(pIVar1,fVar5);
          pIVar1 = local_238;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x342715;
          IVar7 = ::operator+(pIVar1,&local_140);
          fVar5 = local_e0;
          _i2[(long)(points_count * 4 + -4) + 1] = IVar7;
          local_230 = points + (points_count + -1);
          pIVar1 = temp_points + (points_count + -1);
          local_138 = IVar7;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x342768;
          local_150 = ::operator*(pIVar1,fVar5);
          pIVar1 = local_230;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x342783;
          IVar7 = ::operator-(pIVar1,&local_150);
          _i2[(long)(points_count * 4 + -4) + 2] = IVar7;
          local_220 = points + (points_count + -1);
          pIVar1 = temp_points + (points_count + -1);
          fVar5 = local_e0 + local_224;
          local_148 = IVar7;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x3427e2;
          _i1_2 = ::operator*(pIVar1,fVar5);
          pIVar1 = local_220;
          *(undefined8 *)((long)aIStack_280 + lVar2) = 0x3427fd;
          IVar7 = ::operator-(pIVar1,(ImVec2 *)&i1_2);
          _i2[(points_count + -1) * 4 + 3] = IVar7;
        }
        i2_2 = local_1d8->_VtxCurrentIdx;
        for (idx2_1 = 0; pIVar3 = local_1d8, (int)idx2_1 < (int)AA_SIZE; idx2_1 = idx2_1 + 1) {
          if (idx2_1 + 1 == points_count) {
            local_264 = 0.0;
          }
          else {
            local_264 = (float)(idx2_1 + 1);
          }
          dm_x_1 = local_264;
          if (idx2_1 + 1 == points_count) {
            local_268 = (float)local_1d8->_VtxCurrentIdx;
          }
          else {
            local_268 = (float)(i2_2 + 4);
          }
          dm_y_1 = local_268;
          fVar5 = (temp_points[(int)idx2_1].x + temp_points[(int)local_264].x) * 0.5;
          fVar6 = (temp_points[(int)idx2_1].y + temp_points[(int)local_264].y) * 0.5;
          dm_out_x = fVar5 * fVar5 + fVar6 * fVar6;
          if (dm_out_x < 0.5) {
            dm_out_x = 0.5;
          }
          fVar5 = (1.0 / dm_out_x) * fVar5;
          fVar6 = (1.0 / dm_out_x) * fVar6;
          dm_in_x = fVar5 * (local_e0 + 1.0);
          dm_in_y = fVar6 * (local_e0 + 1.0);
          out_vtx_1._4_4_ = fVar5 * local_e0;
          out_vtx_1._0_4_ = fVar6 * local_e0;
          _idx_count_1 = _i2 + ((int)local_264 << 2);
          _idx_count_1->x = points[(int)local_264].x + dm_in_x;
          _idx_count_1->y = points[(int)dm_x_1].y + dm_in_y;
          _idx_count_1[1].x = points[(int)dm_x_1].x + out_vtx_1._4_4_;
          _idx_count_1[1].y = points[(int)dm_x_1].y + out_vtx_1._0_4_;
          _idx_count_1[2].x = points[(int)dm_x_1].x - out_vtx_1._4_4_;
          _idx_count_1[2].y = points[(int)dm_x_1].y - out_vtx_1._0_4_;
          _idx_count_1[3].x = points[(int)dm_x_1].x - dm_in_x;
          _idx_count_1[3].y = points[(int)dm_x_1].y - dm_in_y;
          IVar4 = SUB42(dm_y_1,0);
          *pIVar3->_IdxWritePtr = IVar4 + 1;
          pIVar3->_IdxWritePtr[1] = (ImDrawIdx)i2_2 + 1;
          pIVar3->_IdxWritePtr[2] = (ImDrawIdx)i2_2 + 2;
          pIVar3->_IdxWritePtr[3] = (ImDrawIdx)i2_2 + 2;
          pIVar3->_IdxWritePtr[4] = IVar4 + 2;
          pIVar3->_IdxWritePtr[5] = IVar4 + 1;
          pIVar3->_IdxWritePtr[6] = IVar4 + 1;
          pIVar3->_IdxWritePtr[7] = (ImDrawIdx)i2_2 + 1;
          pIVar3->_IdxWritePtr[8] = (ImDrawIdx)i2_2;
          pIVar3->_IdxWritePtr[9] = (ImDrawIdx)i2_2;
          pIVar3->_IdxWritePtr[10] = IVar4;
          pIVar3->_IdxWritePtr[0xb] = IVar4 + 1;
          pIVar3->_IdxWritePtr[0xc] = IVar4 + 2;
          pIVar3->_IdxWritePtr[0xd] = (ImDrawIdx)i2_2 + 2;
          pIVar3->_IdxWritePtr[0xe] = (ImDrawIdx)i2_2 + 3;
          pIVar3->_IdxWritePtr[0xf] = (ImDrawIdx)i2_2 + 3;
          pIVar3->_IdxWritePtr[0x10] = IVar4 + 3;
          pIVar3->_IdxWritePtr[0x11] = IVar4 + 2;
          pIVar3->_IdxWritePtr = pIVar3->_IdxWritePtr + 0x12;
          i2_2 = (int)dm_y_1;
        }
        for (vtx_count_1 = 0; vtx_count_1 < points_count; vtx_count_1 = vtx_count_1 + 1) {
          local_1d8->_VtxWritePtr->pos = _i2[vtx_count_1 << 2];
          local_1d8->_VtxWritePtr->uv = IStack_30;
          local_1d8->_VtxWritePtr->col = vtx_count;
          local_1d8->_VtxWritePtr[1].pos = _i2[vtx_count_1 * 4 + 1];
          local_1d8->_VtxWritePtr[1].uv = IStack_30;
          local_1d8->_VtxWritePtr[1].col = col;
          local_1d8->_VtxWritePtr[2].pos = _i2[vtx_count_1 * 4 + 2];
          local_1d8->_VtxWritePtr[2].uv = IStack_30;
          local_1d8->_VtxWritePtr[2].col = col;
          local_1d8->_VtxWritePtr[3].pos = _i2[vtx_count_1 * 4 + 3];
          local_1d8->_VtxWritePtr[3].uv = IStack_30;
          local_1d8->_VtxWritePtr[3].col = vtx_count;
          local_1d8->_VtxWritePtr = local_1d8->_VtxWritePtr + 4;
        }
      }
      local_1d8->_VtxCurrentIdx = ((uint)temp_normals & 0xffff) + local_1d8->_VtxCurrentIdx;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = thickness > 1.0f;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y)
                dm_x *= AA_SIZE;
                dm_y *= AA_SIZE;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+0] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+1] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+2] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+3] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+4;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1+2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2+2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1+0); _IdxWritePtr[10] = (ImDrawIdx)(idx2+0); _IdxWritePtr[11] = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2+2); _IdxWritePtr[13] = (ImDrawIdx)(idx1+2); _IdxWritePtr[14] = (ImDrawIdx)(idx1+3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1+3); _IdxWritePtr[16] = (ImDrawIdx)(idx2+3); _IdxWritePtr[17] = (ImDrawIdx)(idx2+2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i*4+0]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i*4+1]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i*4+2]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i*4+3]; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}